

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O1

void rw::buildPlanes(Camera *cam)

{
  float32 fVar1;
  Matrix *pMVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  V3d VVar7;
  V3d local_40;
  V3d local_30;
  V3d local_20;
  
  local_20.x = (float)cam->frustumCorners[1].x - (float)cam->frustumCorners[5].x;
  local_20.y = (float32)((float)cam->frustumCorners[1].y - (float)cam->frustumCorners[5].y);
  local_20.z = (float32)((float)cam->frustumCorners[1].z - (float)cam->frustumCorners[5].z);
  local_30.x = (float)cam->frustumCorners[3].x - (float)cam->frustumCorners[7].x;
  local_30.z = (float32)((float)cam->frustumCorners[3].z - (float)cam->frustumCorners[7].z);
  local_30.y = (float32)((float)cam->frustumCorners[3].y - (float)cam->frustumCorners[7].y);
  pMVar2 = Frame::getLTM((Frame *)(cam->object).object.parent);
  fVar1 = (pMVar2->at).y;
  cam->frustumPlanes[0].plane.normal.x = (pMVar2->at).x;
  cam->frustumPlanes[0].plane.normal.y = fVar1;
  cam->frustumPlanes[0].plane.normal.z = (pMVar2->at).z;
  fVar3 = (float)cam->frustumPlanes[0].plane.normal.x;
  fVar4 = (float)cam->frustumPlanes[0].plane.normal.y;
  fVar5 = (float)cam->frustumPlanes[0].plane.normal.z;
  cam->frustumPlanes[0].plane.distance =
       (float32)((float)cam->frustumCorners[4].z * fVar5 +
                (float)cam->frustumCorners[4].x * fVar3 + (float)cam->frustumCorners[4].y * fVar4);
  cam->frustumPlanes[0].closestX = -fVar3 <= fVar3;
  cam->frustumPlanes[0].closestY = -fVar4 <= fVar4;
  fVar6 = -fVar5;
  cam->frustumPlanes[0].closestZ = fVar6 <= fVar5;
  cam->frustumPlanes[1].plane.normal.x = (float32)-fVar3;
  cam->frustumPlanes[1].plane.normal.y = (float32)-fVar4;
  cam->frustumPlanes[1].plane.normal.z = (float32)fVar6;
  fVar3 = (float)cam->frustumPlanes[1].plane.normal.x;
  fVar4 = (float)cam->frustumPlanes[1].plane.normal.y;
  cam->frustumPlanes[1].plane.distance =
       (float32)(((float)cam->frustumCorners[0].x * fVar3 + (float)cam->frustumCorners[0].y * fVar4)
                - (float)cam->frustumCorners[0].z * fVar5);
  cam->frustumPlanes[1].closestX = 0.0 <= fVar3;
  cam->frustumPlanes[1].closestY = 0.0 <= fVar4;
  cam->frustumPlanes[1].closestZ = fVar5 <= fVar6;
  local_40.x = (float)cam->frustumCorners[6].x - (float)cam->frustumCorners[5].x;
  local_40.z = (float32)((float)cam->frustumCorners[6].z - (float)cam->frustumCorners[5].z);
  local_40.y = (float32)((float)cam->frustumCorners[6].y - (float)cam->frustumCorners[5].y);
  VVar7 = cross(&local_20,&local_40);
  fVar6 = (float)VVar7.z;
  fVar3 = (float)VVar7.x;
  fVar5 = (float)VVar7.y;
  fVar4 = fVar6 * fVar6 + fVar3 * fVar3 + fVar5 * fVar5;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar4 = 1.0 / fVar4;
  cam->frustumPlanes[2].plane.normal.x = (float32)(fVar3 * fVar4);
  cam->frustumPlanes[2].plane.normal.y = (float32)(fVar4 * fVar5);
  cam->frustumPlanes[2].plane.normal.z = (float32)(fVar6 * fVar4);
  fVar3 = (float)cam->frustumPlanes[2].plane.normal.x;
  fVar5 = (float)cam->frustumPlanes[2].plane.normal.y;
  cam->frustumPlanes[2].plane.distance =
       (float32)((float)cam->frustumPlanes[2].plane.normal.z * (float)cam->frustumCorners[1].z +
                fVar3 * (float)cam->frustumCorners[1].x + (float)cam->frustumCorners[1].y * fVar5);
  cam->frustumPlanes[2].closestX = 0.0 <= fVar3;
  cam->frustumPlanes[2].closestY = 0.0 <= fVar5;
  cam->frustumPlanes[2].closestZ = 0.0 <= fVar6 * fVar4;
  local_40.x = (float)cam->frustumCorners[4].x - (float)cam->frustumCorners[5].x;
  local_40.z = (float32)((float)cam->frustumCorners[4].z - (float)cam->frustumCorners[5].z);
  local_40.y = (float32)((float)cam->frustumCorners[4].y - (float)cam->frustumCorners[5].y);
  VVar7 = cross(&local_40,&local_20);
  fVar6 = (float)VVar7.z;
  fVar3 = (float)VVar7.x;
  fVar5 = (float)VVar7.y;
  fVar4 = fVar6 * fVar6 + fVar3 * fVar3 + fVar5 * fVar5;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar4 = 1.0 / fVar4;
  cam->frustumPlanes[3].plane.normal.x = (float32)(fVar3 * fVar4);
  cam->frustumPlanes[3].plane.normal.y = (float32)(fVar4 * fVar5);
  cam->frustumPlanes[3].plane.normal.z = (float32)(fVar6 * fVar4);
  fVar3 = (float)cam->frustumPlanes[3].plane.normal.x;
  fVar5 = (float)cam->frustumPlanes[3].plane.normal.y;
  cam->frustumPlanes[3].plane.distance =
       (float32)((float)cam->frustumPlanes[3].plane.normal.z * (float)cam->frustumCorners[1].z +
                (float)cam->frustumCorners[1].x * fVar3 + (float)cam->frustumCorners[1].y * fVar5);
  cam->frustumPlanes[3].closestX = 0.0 <= fVar3;
  cam->frustumPlanes[3].closestY = 0.0 <= fVar5;
  cam->frustumPlanes[3].closestZ = 0.0 <= fVar6 * fVar4;
  local_40.x = (float)cam->frustumCorners[4].x - (float)cam->frustumCorners[7].x;
  local_40.z = (float32)((float)cam->frustumCorners[4].z - (float)cam->frustumCorners[7].z);
  local_40.y = (float32)((float)cam->frustumCorners[4].y - (float)cam->frustumCorners[7].y);
  VVar7 = cross(&local_30,&local_40);
  fVar6 = (float)VVar7.z;
  fVar3 = (float)VVar7.x;
  fVar5 = (float)VVar7.y;
  fVar4 = fVar6 * fVar6 + fVar3 * fVar3 + fVar5 * fVar5;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar4 = 1.0 / fVar4;
  cam->frustumPlanes[4].plane.normal.x = (float32)(fVar3 * fVar4);
  cam->frustumPlanes[4].plane.normal.y = (float32)(fVar4 * fVar5);
  cam->frustumPlanes[4].plane.normal.z = (float32)(fVar6 * fVar4);
  fVar3 = (float)cam->frustumPlanes[4].plane.normal.x;
  fVar5 = (float)cam->frustumPlanes[4].plane.normal.y;
  cam->frustumPlanes[4].plane.distance =
       (float32)((float)cam->frustumPlanes[4].plane.normal.z * (float)cam->frustumCorners[3].z +
                fVar3 * (float)cam->frustumCorners[3].x + (float)cam->frustumCorners[3].y * fVar5);
  cam->frustumPlanes[4].closestX = 0.0 <= fVar3;
  cam->frustumPlanes[4].closestY = 0.0 <= fVar5;
  cam->frustumPlanes[4].closestZ = 0.0 <= fVar6 * fVar4;
  local_40.x = (float)cam->frustumCorners[6].x - (float)cam->frustumCorners[7].x;
  local_40.z = (float32)((float)cam->frustumCorners[6].z - (float)cam->frustumCorners[7].z);
  local_40.y = (float32)((float)cam->frustumCorners[6].y - (float)cam->frustumCorners[7].y);
  VVar7 = cross(&local_40,&local_30);
  fVar6 = (float)VVar7.z;
  fVar3 = (float)VVar7.x;
  fVar5 = (float)VVar7.y;
  fVar4 = fVar6 * fVar6 + fVar3 * fVar3 + fVar5 * fVar5;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar4 = 1.0 / fVar4;
  cam->frustumPlanes[5].plane.normal.x = (float32)(fVar3 * fVar4);
  cam->frustumPlanes[5].plane.normal.y = (float32)(fVar4 * fVar5);
  cam->frustumPlanes[5].plane.normal.z = (float32)(fVar6 * fVar4);
  fVar3 = (float)cam->frustumPlanes[5].plane.normal.x;
  fVar5 = (float)cam->frustumPlanes[5].plane.normal.y;
  cam->frustumPlanes[5].plane.distance =
       (float32)((float)cam->frustumPlanes[5].plane.normal.z * (float)cam->frustumCorners[3].z +
                (float)cam->frustumCorners[3].x * fVar3 + (float)cam->frustumCorners[3].y * fVar5);
  cam->frustumPlanes[5].closestX = 0.0 <= fVar3;
  cam->frustumPlanes[5].closestY = 0.0 <= fVar5;
  cam->frustumPlanes[5].closestZ = 0.0 <= fVar6 * fVar4;
  return;
}

Assistant:

static void
buildPlanes(Camera *cam)
{
	V3d *c = cam->frustumCorners;
	FrustumPlane *p = cam->frustumPlanes;
	V3d v51 = sub(c[1], c[5]);
	V3d v73 = sub(c[3], c[7]);

	/* Far plane */
	p[0].plane.normal = cam->getFrame()->getLTM()->at;
	p[0].plane.distance = dot(p[0].plane.normal, c[4]);
	p[0].closestX = p[0].plane.normal.x < 0.0f ? 0 : 1;
	p[0].closestY = p[0].plane.normal.y < 0.0f ? 0 : 1;
	p[0].closestZ = p[0].plane.normal.z < 0.0f ? 0 : 1;

	/* Near plane */
	p[1].plane.normal = neg(p[0].plane.normal);
	p[1].plane.distance = dot(p[1].plane.normal, c[0]);
	p[1].closestX = p[1].plane.normal.x < 0.0f ? 0 : 1;
	p[1].closestY = p[1].plane.normal.y < 0.0f ? 0 : 1;
	p[1].closestZ = p[1].plane.normal.z < 0.0f ? 0 : 1;

	/* Right plane */
	p[2].plane.normal = normalize(cross(v51,
	                                    sub(c[6], c[5])));
	p[2].plane.distance = dot(p[2].plane.normal, c[1]);
	p[2].closestX = p[2].plane.normal.x < 0.0f ? 0 : 1;
	p[2].closestY = p[2].plane.normal.y < 0.0f ? 0 : 1;
	p[2].closestZ = p[2].plane.normal.z < 0.0f ? 0 : 1;

	/* Top plane */
	p[3].plane.normal = normalize(cross(sub(c[4], c[5]),
	                                    v51));
	p[3].plane.distance = dot(p[3].plane.normal, c[1]);
	p[3].closestX = p[3].plane.normal.x < 0.0f ? 0 : 1;
	p[3].closestY = p[3].plane.normal.y < 0.0f ? 0 : 1;
	p[3].closestZ = p[3].plane.normal.z < 0.0f ? 0 : 1;

	/* Left plane */
	p[4].plane.normal = normalize(cross(v73,
	                                    sub(c[4], c[7])));
	p[4].plane.distance = dot(p[4].plane.normal, c[3]);
	p[4].closestX = p[4].plane.normal.x < 0.0f ? 0 : 1;
	p[4].closestY = p[4].plane.normal.y < 0.0f ? 0 : 1;
	p[4].closestZ = p[4].plane.normal.z < 0.0f ? 0 : 1;

	/* Bottom plane */
	p[5].plane.normal = normalize(cross(sub(c[6], c[7]),
	                                    v73));
	p[5].plane.distance = dot(p[5].plane.normal, c[3]);
	p[5].closestX = p[5].plane.normal.x < 0.0f ? 0 : 1;
	p[5].closestY = p[5].plane.normal.y < 0.0f ? 0 : 1;
	p[5].closestZ = p[5].plane.normal.z < 0.0f ? 0 : 1;
}